

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O0

void printAddressingMode(SStream *O,uint pc,cs_m68k *inst,cs_m68k_op *op)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  SStream *in_RCX;
  long in_RDX;
  int in_ESI;
  SStream *in_RDI;
  undefined8 uVar9;
  cs_m68k_op *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  
  pcVar8 = s_spacing;
  switch((cs_m68k_op *)(ulong)*(uint *)(in_RCX->buffer + 0x34)) {
  case (cs_m68k_op *)0x0:
    iVar2 = *(int *)(in_RCX->buffer + 0x30);
    if (iVar2 == 1) {
      SStream_concat(in_RDI,"%s",s_reg_names[*(uint *)in_RCX->buffer]);
    }
    else if (iVar2 == 6) {
      registerBits(in_RCX,(cs_m68k_op *)(ulong)*(uint *)(in_RCX->buffer + 0x34));
    }
    else if (iVar2 == 7) {
      registerPair((SStream *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
    }
    break;
  case (cs_m68k_op *)0x1:
    SStream_concat(in_RDI,"d%d",(ulong)(*(int *)in_RCX->buffer - 1));
    break;
  case (cs_m68k_op *)0x2:
    SStream_concat(in_RDI,"a%d",(ulong)(*(int *)in_RCX->buffer - 9));
    break;
  case (cs_m68k_op *)0x3:
    SStream_concat(in_RDI,"(a%d)",(ulong)(*(int *)in_RCX->buffer - 9));
    break;
  case (cs_m68k_op *)0x4:
    SStream_concat(in_RDI,"(a%d)+",(ulong)(*(int *)in_RCX->buffer - 9));
    break;
  case (cs_m68k_op *)0x5:
    SStream_concat(in_RDI,"-(a%d)",(ulong)(*(int *)in_RCX->buffer - 9));
    break;
  case (cs_m68k_op *)0x6:
    pcVar8 = anon_var_dwarf_290687 + 0x11;
    if (*(short *)(in_RCX->buffer + 0x1c) < 0) {
      pcVar8 = "-";
    }
    uVar3 = (uint)*(short *)(in_RCX->buffer + 0x1c);
    if ((int)uVar3 < 1) {
      uVar3 = -uVar3;
    }
    SStream_concat(in_RDI,"%s$%x(a%d)",pcVar8,(ulong)uVar3,(ulong)(*(int *)(in_RCX->buffer + 8) - 9)
                  );
    break;
  case (cs_m68k_op *)0x7:
    pcVar8 = anon_var_dwarf_290687 + 0x11;
    if (*(short *)(in_RCX->buffer + 0x1c) < 0) {
      pcVar8 = "-";
    }
    uVar3 = (uint)*(short *)(in_RCX->buffer + 0x1c);
    if ((int)uVar3 < 1) {
      uVar3 = -uVar3;
    }
    pcVar5 = getRegName(*(m68k_reg *)(in_RCX->buffer + 8));
    pcVar7 = s_spacing;
    pcVar6 = getRegName(*(m68k_reg *)(in_RCX->buffer + 0xc));
    uVar4 = 0x77;
    if (in_RCX->buffer[0x22] != '\0') {
      uVar4 = 0x6c;
    }
    SStream_concat(in_RDI,"%s$%x(%s,%s%s.%c)",pcVar8,(ulong)uVar3,pcVar5,pcVar7,pcVar6,uVar4);
    break;
  case (cs_m68k_op *)0x8:
  case (cs_m68k_op *)0xd:
    if (*(int *)(in_RCX->buffer + 0x34) == 0xd) {
      SStream_concat(in_RDI,"$%x",(ulong)(uint)(in_ESI + 2 + *(int *)(in_RCX->buffer + 0x14)));
    }
    else if (*(int *)(in_RCX->buffer + 0x14) != 0) {
      SStream_concat(in_RDI,"$%x",(ulong)*(uint *)(in_RCX->buffer + 0x14));
    }
    SStream_concat(in_RDI,"(");
    if (*(int *)(in_RCX->buffer + 0x34) == 0xd) {
      pcVar8 = getRegName(*(m68k_reg *)(in_RCX->buffer + 0xc));
      uVar9 = 0x77;
      if (in_RCX->buffer[0x22] != '\0') {
        uVar9 = 0x6c;
      }
      SStream_concat(in_RDI,"pc,%s.%c",pcVar8,uVar9);
    }
    else {
      if (*(int *)(in_RCX->buffer + 8) != 0) {
        SStream_concat(in_RDI,"a%d,%s",(ulong)(*(int *)(in_RCX->buffer + 8) - 9),s_spacing);
      }
      pcVar8 = getRegName(*(m68k_reg *)(in_RCX->buffer + 0xc));
      uVar9 = 0x77;
      if (in_RCX->buffer[0x22] != '\0') {
        uVar9 = 0x6c;
      }
      SStream_concat(in_RDI,"%s.%c",pcVar8,uVar9);
    }
    if (in_RCX->buffer[0x1e] == '\0') {
      SStream_concat(in_RDI,")");
    }
    else {
      SStream_concat(in_RDI,"%s*%s%d)",s_spacing,s_spacing,(ulong)(byte)in_RCX->buffer[0x1e]);
    }
    break;
  case (cs_m68k_op *)0x9:
  case (cs_m68k_op *)0xa:
  case (cs_m68k_op *)0xe:
  case (cs_m68k_op *)0xf:
    SStream_concat(in_RDI,"([");
    if ((*(int *)(in_RCX->buffer + 0x34) == 0xe) || (*(int *)(in_RCX->buffer + 0x34) == 0xf)) {
      SStream_concat(in_RDI,"$%x",(ulong)(uint)(in_ESI + 2 + *(int *)(in_RCX->buffer + 0x14)));
    }
    else if (*(int *)(in_RCX->buffer + 0x14) != 0) {
      SStream_concat(in_RDI,"$%x",(ulong)*(uint *)(in_RCX->buffer + 0x14));
    }
    pcVar8 = s_spacing;
    if (*(int *)(in_RCX->buffer + 8) != 0) {
      if (*(int *)(in_RCX->buffer + 0x14) == 0) {
        pcVar8 = getRegName(*(m68k_reg *)(in_RCX->buffer + 8));
        SStream_concat(in_RDI,"%s",pcVar8);
      }
      else {
        pcVar7 = getRegName(*(m68k_reg *)(in_RCX->buffer + 8));
        SStream_concat(in_RDI,",%s%s",pcVar8,pcVar7);
      }
    }
    if ((*(int *)(in_RCX->buffer + 0x34) == 9) || (*(int *)(in_RCX->buffer + 0x34) == 0xe)) {
      SStream_concat(in_RDI,"]");
    }
    pcVar8 = s_spacing;
    if (*(int *)(in_RCX->buffer + 0xc) != 0) {
      pcVar7 = getRegName(*(m68k_reg *)(in_RCX->buffer + 0xc));
      uVar9 = 0x77;
      if (in_RCX->buffer[0x22] != '\0') {
        uVar9 = 0x6c;
      }
      SStream_concat(in_RDI,",%s%s.%c",pcVar8,pcVar7,uVar9);
    }
    if (in_RCX->buffer[0x1e] != '\0') {
      SStream_concat(in_RDI,"%s*%s%d",s_spacing,s_spacing,(ulong)(byte)in_RCX->buffer[0x1e]);
    }
    if ((*(int *)(in_RCX->buffer + 0x34) == 10) || (*(int *)(in_RCX->buffer + 0x34) == 0xf)) {
      SStream_concat(in_RDI,"]");
    }
    if (*(int *)(in_RCX->buffer + 0x18) != 0) {
      SStream_concat(in_RDI,",%s$%x",s_spacing,(ulong)*(uint *)(in_RCX->buffer + 0x18));
    }
    SStream_concat(in_RDI,")");
    break;
  case (cs_m68k_op *)0xb:
    SStream_concat(in_RDI,"$%x(pc)",
                   (ulong)(uint)(in_ESI + 2 + (int)*(short *)(in_RCX->buffer + 0x1c)));
    break;
  case (cs_m68k_op *)0xc:
    sVar1 = *(short *)(in_RCX->buffer + 0x1c);
    pcVar7 = getRegName(*(m68k_reg *)(in_RCX->buffer + 0xc));
    uVar9 = 0x77;
    if (in_RCX->buffer[0x22] != '\0') {
      uVar9 = 0x6c;
    }
    SStream_concat(in_RDI,"$%x(pc,%s%s.%c)",(ulong)(uint)(in_ESI + 2 + (int)sVar1),pcVar8,pcVar7,
                   uVar9);
    break;
  case (cs_m68k_op *)0x10:
    SStream_concat(in_RDI,"$%x.w",*(undefined8 *)in_RCX->buffer);
    break;
  case (cs_m68k_op *)0x11:
    SStream_concat(in_RDI,"$%x.l",*(undefined8 *)in_RCX->buffer);
    break;
  case (cs_m68k_op *)0x12:
    if (*(int *)(in_RDX + 0xe0) == 2) {
      if (*(int *)(in_RDX + 0xe4) == 4) {
        SStream_concat((SStream *)(double)*(float *)in_RCX->buffer,in_RDI->buffer,"#%f");
      }
      else if (*(int *)(in_RDX + 0xe4) == 8) {
        SStream_concat(*(SStream **)in_RCX->buffer,in_RDI->buffer,"#%f");
      }
      else {
        SStream_concat(in_RDI,"#<unsupported>");
      }
    }
    else {
      SStream_concat(in_RDI,"#$%x",*(undefined8 *)in_RCX->buffer);
    }
    break;
  case (cs_m68k_op *)0x13:
    SStream_concat(in_RDI,"$%x",(ulong)(uint)(in_ESI + 2 + *(int *)(in_RCX->buffer + 0x24)));
  }
  if (in_RCX->buffer[0x1f] != '\0') {
    SStream_concat(in_RDI,"{%d:%d}",(ulong)(byte)in_RCX->buffer[0x21],
                   (ulong)(byte)in_RCX->buffer[0x20]);
  }
  return;
}

Assistant:

static void printAddressingMode(SStream* O, unsigned int pc, const cs_m68k* inst, const cs_m68k_op* op)
{
	switch (op->address_mode) {
		case M68K_AM_NONE:
			switch (op->type) {
				case M68K_OP_REG_BITS:
					registerBits(O, op);
					break;
				case M68K_OP_REG_PAIR:
					registerPair(O, op);
					break;
				case M68K_OP_REG:
					SStream_concat(O, "%s", s_reg_names[op->reg]);
					break;
				default:
					break;
			}
			break;

		case M68K_AM_REG_DIRECT_DATA: SStream_concat(O, "d%d", (op->reg - M68K_REG_D0)); break;
		case M68K_AM_REG_DIRECT_ADDR: SStream_concat(O, "a%d", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR: SStream_concat(O, "(a%d)", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR_POST_INC: SStream_concat(O, "(a%d)+", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR_PRE_DEC: SStream_concat(O, "-(a%d)", (op->reg - M68K_REG_A0)); break;
		case M68K_AM_REGI_ADDR_DISP: SStream_concat(O, "%s$%x(a%d)", op->mem.disp < 0 ? "-" : "", abs(op->mem.disp), (op->mem.base_reg - M68K_REG_A0)); break;
		case M68K_AM_PCI_DISP: SStream_concat(O, "$%x(pc)", pc + 2 + op->mem.disp); break;
		case M68K_AM_ABSOLUTE_DATA_SHORT: SStream_concat(O, "$%x.w", op->imm); break;
		case M68K_AM_ABSOLUTE_DATA_LONG: SStream_concat(O, "$%x.l", op->imm); break;
		case M68K_AM_IMMEDIATE:
			 if (inst->op_size.type == M68K_SIZE_TYPE_FPU) {
#if defined(_KERNEL_MODE)
				 // Issue #681: Windows kernel does not support formatting float point
				 SStream_concat(O, "#<float_point_unsupported>");
				 break;
#else
				 if (inst->op_size.fpu_size == M68K_FPU_SIZE_SINGLE)
					 SStream_concat(O, "#%f", op->simm);
				 else if (inst->op_size.fpu_size == M68K_FPU_SIZE_DOUBLE)
					 SStream_concat(O, "#%f", op->dimm);
				 else
					 SStream_concat(O, "#<unsupported>");
				 break;
#endif
			 }
			 SStream_concat(O, "#$%x", op->imm);
			 break;
		case M68K_AM_PCI_INDEX_8_BIT_DISP:
			SStream_concat(O, "$%x(pc,%s%s.%c)", pc + 2 + op->mem.disp, s_spacing, getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			break;
		case M68K_AM_AREGI_INDEX_8_BIT_DISP:
			SStream_concat(O, "%s$%x(%s,%s%s.%c)", op->mem.disp < 0 ? "-" : "", abs(op->mem.disp), getRegName(op->mem.base_reg), s_spacing, getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			break;
		case M68K_AM_PCI_INDEX_BASE_DISP:
		case M68K_AM_AREGI_INDEX_BASE_DISP:

			if (op->address_mode == M68K_AM_PCI_INDEX_BASE_DISP) {
				SStream_concat(O, "$%x", pc + 2 + op->mem.in_disp);
			} else {
				if (op->mem.in_disp > 0)
					SStream_concat(O, "$%x", op->mem.in_disp);
			}

			SStream_concat(O, "(");

			if (op->address_mode == M68K_AM_PCI_INDEX_BASE_DISP) {
			    SStream_concat(O, "pc,%s.%c", getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			} else {
				if (op->mem.base_reg != M68K_REG_INVALID)
					SStream_concat(O, "a%d,%s", op->mem.base_reg - M68K_REG_A0, s_spacing);
				SStream_concat(O, "%s.%c", getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');
			}

			if (op->mem.scale > 0)
			    SStream_concat(O, "%s*%s%d)", s_spacing, s_spacing, op->mem.scale);
			else
			    SStream_concat(O, ")");
			break;
			// It's ok to just use PCMI here as is as we set base_reg to PC in the disassembler. While this is not strictly correct it makes the code
			// easier and that is what actually happens when the code is executed anyway.

		case M68K_AM_PC_MEMI_POST_INDEX:
		case M68K_AM_PC_MEMI_PRE_INDEX:
		case M68K_AM_MEMI_PRE_INDEX:
		case M68K_AM_MEMI_POST_INDEX:
			SStream_concat(O, "([");

			if (op->address_mode == M68K_AM_PC_MEMI_POST_INDEX || op->address_mode == M68K_AM_PC_MEMI_PRE_INDEX) {
				SStream_concat(O, "$%x", pc + 2 + op->mem.in_disp);
			} else {
				if (op->mem.in_disp > 0)
					SStream_concat(O, "$%x", op->mem.in_disp);
			}

			if (op->mem.base_reg != M68K_REG_INVALID) {
				if (op->mem.in_disp > 0)
					SStream_concat(O, ",%s%s", s_spacing, getRegName(op->mem.base_reg));
				else
					SStream_concat(O, "%s", getRegName(op->mem.base_reg));
			}

			if (op->address_mode == M68K_AM_MEMI_POST_INDEX || op->address_mode == M68K_AM_PC_MEMI_POST_INDEX)
			    SStream_concat(O, "]");

			if (op->mem.index_reg != M68K_REG_INVALID)
			    SStream_concat(O, ",%s%s.%c", s_spacing, getRegName(op->mem.index_reg), op->mem.index_size ? 'l' : 'w');

			if (op->mem.scale > 0)
			    SStream_concat(O, "%s*%s%d", s_spacing, s_spacing, op->mem.scale);

			if (op->address_mode == M68K_AM_MEMI_PRE_INDEX || op->address_mode == M68K_AM_PC_MEMI_PRE_INDEX)
			    SStream_concat(O, "]");

			if (op->mem.out_disp > 0)
			    SStream_concat(O, ",%s$%x", s_spacing, op->mem.out_disp);

			SStream_concat(O, ")");
			break;
		case M68K_AM_BRANCH_DISPLACEMENT:
			SStream_concat(O, "$%x", pc + 2 + op->br_disp.disp);
		default:
			break;
	}

	if (op->mem.bitfield)
		SStream_concat(O, "{%d:%d}", op->mem.offset, op->mem.width);
}